

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemNumerify(Mem *pMem)

{
  int iVar1;
  double dVar2;
  Mem *pMem_local;
  
  if ((pMem->flags & 0xd) == 0) {
    iVar1 = sqlite3Atoi64(pMem->z,&(pMem->u).i,pMem->n,pMem->enc);
    if (iVar1 == 0) {
      pMem->flags = pMem->flags & 0xbe00 | 4;
    }
    else {
      dVar2 = sqlite3VdbeRealValue(pMem);
      pMem->r = dVar2;
      pMem->flags = pMem->flags & 0xbe00 | 8;
      sqlite3VdbeIntegerAffinity(pMem);
    }
  }
  pMem->flags = pMem->flags & 0xffed;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemNumerify(Mem *pMem){
  if( (pMem->flags & (MEM_Int|MEM_Real|MEM_Null))==0 ){
    assert( (pMem->flags & (MEM_Blob|MEM_Str))!=0 );
    assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
    if( 0==sqlite3Atoi64(pMem->z, &pMem->u.i, pMem->n, pMem->enc) ){
      MemSetTypeFlag(pMem, MEM_Int);
    }else{
      pMem->r = sqlite3VdbeRealValue(pMem);
      MemSetTypeFlag(pMem, MEM_Real);
      sqlite3VdbeIntegerAffinity(pMem);
    }
  }
  assert( (pMem->flags & (MEM_Int|MEM_Real|MEM_Null))!=0 );
  pMem->flags &= ~(MEM_Str|MEM_Blob);
  return SQLITE_OK;
}